

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O3

void uv_sem_wait(uv_sem_t *sem)

{
  pthread_mutex_t *__mutex;
  int iVar1;
  int *piVar2;
  
  if (platform_needs_custom_semaphore == 0) {
    do {
      iVar1 = sem_wait((sem_t *)sem);
      if (iVar1 != -1) goto LAB_00118b78;
      piVar2 = __errno_location();
    } while (*piVar2 == 4);
  }
  else {
    __mutex = *(pthread_mutex_t **)sem;
    iVar1 = pthread_mutex_lock(__mutex);
    if (iVar1 == 0) {
      do {
        if (*(int *)((long)__mutex + 0x58) != 0) {
          *(int *)((long)__mutex + 0x58) = *(int *)((long)__mutex + 0x58) + -1;
          iVar1 = pthread_mutex_unlock(__mutex);
LAB_00118b78:
          if (iVar1 == 0) {
            return;
          }
          break;
        }
        iVar1 = pthread_cond_wait((pthread_cond_t *)(__mutex + 1),__mutex);
      } while (iVar1 == 0);
    }
  }
  abort();
}

Assistant:

void uv_sem_wait(uv_sem_t* sem) {
  if (platform_needs_custom_semaphore)
    uv__custom_sem_wait(sem);
  else
    uv__sem_wait(sem);
}